

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::StringCompareMethod::StringCompareMethod
          (StringCompareMethod *this,Builtins *builtins,KnownSystemName knownNameId,bool ignoreCase)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_49;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_48;
  Type *local_30;
  
  local_30 = &(builtins->stringType).super_Type;
  __l._M_len = 1;
  __l._M_array = &local_30;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_48,__l,&local_49);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,knownNameId,Function,1,&local_48,
             (Type *)&builtins->intType,true,false);
  if (local_48.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_005ea800;
  (this->super_SimpleSystemSubroutine).field_0x62 = ignoreCase;
  return;
}

Assistant:

StringCompareMethod(const Builtins& builtins, KnownSystemName knownNameId, bool ignoreCase) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 1, {&builtins.stringType},
                               builtins.intType, true),
        ignoreCase(ignoreCase) {}